

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptivescannero1.cpp
# Opt level: O3

void __thiscall
AdaptiveScannerO1::AdaptiveScannerO1
          (AdaptiveScannerO1 *this,int xmin,int ymin,int xmax,int ymax,int a,int b,int nbs,
          bool *steps,int cx,int cy,int length)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  int iVar4;
  int iVar5;
  bool *pbVar6;
  bool *pbVar7;
  
  (this->super_DirectionalScanner).xmin = xmin;
  (this->super_DirectionalScanner).ymin = ymin;
  (this->super_DirectionalScanner).xmax = xmax;
  (this->super_DirectionalScanner).ymax = ymax;
  (this->super_DirectionalScanner).nbs = nbs;
  (this->super_DirectionalScanner).steps = steps;
  (this->super_DirectionalScanner).ccx = cx;
  (this->super_DirectionalScanner).ccy = cy;
  (this->super_DirectionalScanner).lcx = cx;
  (this->super_DirectionalScanner).lcy = cy;
  (this->super_DirectionalScanner).clearance = true;
  (this->super_DirectionalScanner)._vptr_DirectionalScanner =
       (_func_int **)&PTR__DirectionalScanner_00158468;
  (this->super_DirectionalScanner).dla = a;
  (this->super_DirectionalScanner).dlb = b;
  pbVar3 = steps + nbs;
  (this->super_DirectionalScanner).fs = pbVar3;
  iVar1 = cx;
  if (length < 1) {
    iVar4 = cy * b + cx * a;
    this->dlc1 = iVar4;
    (this->super_DirectionalScanner).lst2 = pbVar3;
    (this->super_DirectionalScanner).rst2 = pbVar3;
    iVar5 = cy;
  }
  else {
    iVar2 = (length - (length + 1 >> 0x1f)) + 1 >> 1;
    iVar5 = 1;
    if (1 < iVar2) {
      iVar5 = iVar2;
    }
    pbVar7 = pbVar3;
    iVar4 = iVar5;
    do {
      pbVar6 = pbVar7 + -1;
      if (pbVar7 + -1 < steps) {
        pbVar6 = pbVar3 + -1;
        pbVar7 = pbVar3;
      }
      if (pbVar7[-1] == true) {
        iVar1 = iVar1 + 1;
        (this->super_DirectionalScanner).lcx = iVar1;
      }
      iVar4 = iVar4 + -1;
      pbVar7 = pbVar6;
    } while (iVar4 != 0);
    iVar5 = cy - iVar5;
    iVar4 = iVar5 * b + iVar1 * a;
    (this->super_DirectionalScanner).lcy = iVar5;
    this->dlc1 = iVar4;
    (this->super_DirectionalScanner).lst2 = pbVar6;
    (this->super_DirectionalScanner).rst2 = pbVar6;
    if (0 < length) {
      iVar2 = iVar2 + 1;
      pbVar7 = steps;
      do {
        cx = cx - (uint)*pbVar7;
        cy = cy + 1;
        pbVar7 = pbVar7 + 1;
        if (pbVar3 <= pbVar7) {
          pbVar7 = steps;
        }
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
  }
  iVar2 = cy * b + cx * a;
  (this->super_DirectionalScanner).dlc2 = iVar2;
  *(int *)&(this->super_DirectionalScanner).field_0x64 = a;
  this->templ_b = b;
  this->templ_nu = iVar4 - iVar2;
  (this->super_DirectionalScanner).rcx = iVar1;
  (this->super_DirectionalScanner).rcy = iVar5;
  return;
}

Assistant:

AdaptiveScannerO1::AdaptiveScannerO1 (
                          int xmin, int ymin, int xmax, int ymax,
                          int a, int b,
                          int nbs, bool *steps, int cx, int cy, int length)
                    : DirectionalScanner (xmin, ymin, xmax, ymax,
                                          nbs, steps, cx, cy)
{
  this->dla = a;
  this->dlb = b;
  fs = steps + nbs;
  int w_2 = (length + 1) / 2;

  // Looking for the central scan start position
  bool *st = steps + nbs;
  for (int i = 0; i < w_2; i++)
  {
    if (--st < steps) st = steps + nbs - 1;
    if (*st) lcx ++;
    lcy --;
  }
  dlc1 = dla * lcx + dlb * lcy;
  lst2 = st;
  rst2 = st;

  // Looking for the upper leaning line
  st = steps;
  while (w_2-- > 0)
  {
    if (*st) cx--;
    cy++;
    if (++st >= fs) st = steps;
  }
  dlc2 = dla * cx + dlb * cy;

  this->templ_a = a;
  this->templ_b = b;
  this->templ_nu = this->dlc1 - this->dlc2;

  rcx = lcx;
  rcy = lcy;
}